

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dscal.c
# Opt level: O1

int dscal_(int *n,double *sa,double *sx,int *incx)

{
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)*n;
  iVar2 = *incx;
  if (0 < iVar2 && 0 < lVar3) {
    dVar1 = *sa;
    if (iVar2 == 1) {
      if (*n < 5) {
        lVar4 = 0;
      }
      else {
        lVar4 = 0;
        do {
          sx[lVar4] = sx[lVar4] * dVar1;
          sx[lVar4 + 1] = sx[lVar4 + 1] * dVar1;
          sx[lVar4 + 2] = sx[lVar4 + 2] * dVar1;
          sx[lVar4 + 3] = sx[lVar4 + 3] * dVar1;
          sx[lVar4 + 4] = sx[lVar4 + 4] * dVar1;
          lVar4 = lVar4 + 5;
        } while (lVar4 < lVar3 + -4);
      }
      if (lVar4 < lVar3) {
        do {
          sx[lVar4] = sx[lVar4] * dVar1;
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
    }
    else {
      lVar4 = 0;
      do {
        sx[lVar4] = sx[lVar4] * dVar1;
        lVar4 = lVar4 + iVar2;
      } while (lVar4 < lVar3 * iVar2);
    }
  }
  return 0;
}

Assistant:

int dscal_(int *n, double *sa, double *sx, int *incx)
{
  long int i, m, nincx, nn, iincx;
  double ssa;

  /* scales a vector by a constant.   
     uses unrolled loops for increment equal to 1.   
     jack dongarra, linpack, 3/11/78.   
     modified 3/93 to return if incx .le. 0.   
     modified 12/3/93, array(1) declarations changed to array(*) */

  /* Dereference inputs */
  nn = *n;
  iincx = *incx;
  ssa = *sa;

  if (nn > 0 && iincx > 0)
  {
    if (iincx == 1) /* code for increment equal to 1 */
    {
      m = nn-4;
      for (i = 0; i < m; i += 5)
      {
        sx[i] = ssa * sx[i];
        sx[i+1] = ssa * sx[i+1];
        sx[i+2] = ssa * sx[i+2];
        sx[i+3] = ssa * sx[i+3];
        sx[i+4] = ssa * sx[i+4];
      }
      for ( ; i < nn; ++i) /* clean-up loop */
        sx[i] = ssa * sx[i];
    }
    else /* code for increment not equal to 1 */
    {
      nincx = nn * iincx;
      for (i = 0; i < nincx; i += iincx)
        sx[i] = ssa * sx[i];
    }
  }

  return 0;
}